

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_impl.hpp
# Opt level: O2

void __thiscall lightconf::value::value(value *this,group *grp)

{
  this->type_ = group_type;
  (this->string_value_)._M_dataplus._M_p = (pointer)&(this->string_value_).field_2;
  (this->string_value_)._M_string_length = 0;
  (this->string_value_).field_2._M_local_buf[0] = '\0';
  (this->vector_value_).super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vector_value_).super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vector_value_).super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  group::group(&this->group_value_,grp);
  return;
}

Assistant:

inline value::value(const group& grp)           : type_(value_type::group_type), group_value_(grp) { }